

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O0

double baryonyx::itm::
       compute_duration<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
                 (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                  *first,time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                         *last)

{
  rep_conflict rVar1;
  duration<double,_std::ratio<1L,_1L>_> local_28;
  __enable_if_is_duration<std::chrono::duration<double>_> dc;
  type diff;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *last_local;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *first_local;
  
  dc.__r = (rep_conflict)std::chrono::operator-(last,first);
  local_28.__r = (rep_conflict)
                 std::chrono::
                 duration_cast<std::chrono::duration<double,std::ratio<1l,1l>>,long,std::ratio<1l,1000000000l>>
                           ((duration<long,_std::ratio<1L,_1000000000L>_> *)&dc);
  rVar1 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_28);
  return rVar1;
}

Assistant:

double
compute_duration(const TimePoint& first, const TimePoint& last) noexcept
{
    namespace sc = std::chrono;

    auto diff = last - first;
    auto dc = sc::duration_cast<sc::duration<double, std::ratio<1>>>(diff);

    return dc.count();
}